

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::CountDriversFunc::bindArgument
          (CountDriversFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *param_5)

{
  int iVar1;
  Compilation *this_00;
  undefined4 extraout_var;
  int in_ECX;
  sockaddr *in_RDX;
  long in_RSI;
  bool in_stack_0000010f;
  ASTContext *in_stack_00000110;
  Type *in_stack_00000118;
  ExpressionSyntax *in_stack_00000120;
  SourceLocation in_stack_00000128;
  bitmask<slang::ast::ASTFlags> local_50;
  SyntaxNode *local_48;
  SyntaxNode *this_01;
  Expression *local_8;
  
  if (in_RSI == 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_50,None);
    iVar1 = Expression::bind(in_ECX,in_RDX,(socklen_t)local_50.m_bits);
    local_8 = (Expression *)CONCAT44(extraout_var,iVar1);
  }
  else {
    this_01 = local_48;
    this_00 = ASTContext::getCompilation((ASTContext *)0xb26f79);
    Compilation::getIntType(this_00);
    _local_48 = slang::syntax::SyntaxNode::getFirstToken(this_01);
    parsing::Token::location((Token *)&local_48);
    local_8 = Expression::bindLValue
                        (in_stack_00000120,in_stack_00000118,in_stack_00000128,in_stack_00000110,
                         in_stack_0000010f);
  }
  return local_8;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args&) const final {
        if (argIndex > 0) {
            return Expression::bindLValue(syntax, context.getCompilation().getIntType(),
                                          syntax.getFirstToken().location(), context,
                                          /* isInout */ false);
        }
        return Expression::bind(syntax, context);
    }